

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_invalidInput_Test::~ModelFlattening_invalidInput_Test
          (ModelFlattening_invalidInput_Test *this)

{
  ModelFlattening_invalidInput_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(ModelFlattening, invalidInput)
{
    auto importer = libcellml::Importer::create();

    auto flatModel = importer->flattenModel(nullptr);

    EXPECT_EQ(nullptr, flatModel);
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ("The model is null.", importer->issue(0)->description());
    EXPECT_EQ(libcellml::Issue::ReferenceRule::INVALID_ARGUMENT, importer->issue(0)->referenceRule());
}